

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O2

int utest_main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  void *__ptr;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int result;
  char *local_70;
  char *colours [3];
  long local_50;
  long local_48;
  
  iVar3 = isatty(1);
  colours[2] = "\x1b[31m";
  colours[0] = "\x1b[0m";
  colours[1] = "\x1b[32m";
  if (iVar3 == 0) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      colours[lVar6] = "";
    }
  }
  uVar7 = 1;
  local_70 = (char *)0x0;
  do {
    pcVar8 = local_70;
    if ((ulong)(long)argc <= uVar7) {
      lVar6 = 0x10;
      lVar9 = 0;
      for (uVar7 = 0; uVar7 < utest_state.tests_length; uVar7 = uVar7 + 1) {
        iVar3 = utest_should_filter_test
                          (pcVar8,*(char **)((long)&(utest_state.tests)->func + lVar6));
        lVar9 = lVar9 + (ulong)(iVar3 == 0);
        lVar6 = lVar6 + 0x18;
      }
      printf("%s[==========]%s Running %lu test cases.\n",colours[1],colours[0],lVar9);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)utest_state.output);
        fprintf((FILE *)utest_state.output,"<testsuites tests=\"%lu\" name=\"All\">\n",lVar9);
        fprintf((FILE *)utest_state.output,"<testsuite name=\"Tests\" tests=\"%lu\">\n",lVar9);
      }
      lVar6 = 0;
      __ptr = (void *)0x0;
      local_50 = 0;
      local_48 = 0;
      for (uVar7 = 0; pcVar2 = colours[1], pcVar1 = colours[0], uVar7 < utest_state.tests_length;
          uVar7 = uVar7 + 1) {
        result = 0;
        iVar3 = utest_should_filter_test
                          (pcVar8,*(char **)((long)&(utest_state.tests)->name + lVar6));
        pcVar2 = colours[1];
        pcVar1 = colours[0];
        if (iVar3 == 0) {
          printf("%s[ RUN      ]%s %s\n",colours[1],colours[0],
                 *(undefined8 *)((long)&(utest_state.tests)->name + lVar6));
          if (utest_state.output != (FILE *)0x0) {
            fprintf((FILE *)utest_state.output,"<testcase name=\"%s\">",
                    *(undefined8 *)((long)&(utest_state.tests)->name + lVar6));
          }
          iVar4 = utest_ns();
          (**(code **)((long)&(utest_state.tests)->func + lVar6))
                    (&result,*(undefined8 *)((long)&(utest_state.tests)->index + lVar6));
          iVar5 = utest_ns();
          if (utest_state.output != (FILE *)0x0) {
            fwrite("</testcase>\n",0xc,1,(FILE *)utest_state.output);
          }
          if (result == 0) {
            printf("%s[       OK ]%s %s (%ldns)\n",pcVar2,pcVar1,
                   *(undefined8 *)((long)&(utest_state.tests)->name + lVar6),iVar5 - iVar4);
            pcVar8 = local_70;
          }
          else {
            __ptr = realloc(__ptr,local_50 * 8 + 8);
            *(ulong *)((long)__ptr + local_50 * 8) = uVar7;
            local_48 = local_48 + 1;
            printf("%s[  FAILED  ]%s %s (%ldns)\n",colours[2],colours[0],
                   *(undefined8 *)((long)&(utest_state.tests)->name + lVar6),iVar5 - iVar4);
            pcVar8 = local_70;
            local_50 = local_50 + 1;
          }
        }
        lVar6 = lVar6 + 0x18;
      }
      printf("%s[==========]%s %lu test cases ran.\n",colours[1],colours[0],lVar9);
      printf("%s[  PASSED  ]%s %lu tests.\n",pcVar2,pcVar1,lVar9 - local_48);
      pcVar8 = colours[2];
      if (local_48 != 0) {
        printf("%s[  FAILED  ]%s %lu tests, listed below:\n",colours[2],pcVar1,local_48);
        for (lVar6 = 0; local_50 != lVar6; lVar6 = lVar6 + 1) {
          printf("%s[  FAILED  ]%s %s\n",pcVar8,pcVar1,
                 utest_state.tests[*(long *)((long)__ptr + lVar6 * 8)].name);
        }
      }
      if (utest_state.output != (FILE *)0x0) {
        fwrite("</testsuite>\n</testsuites>\n",0x1b,1,(FILE *)utest_state.output);
      }
LAB_0010b257:
      lVar6 = 0x10;
      for (uVar7 = 0; uVar7 < utest_state.tests_length; uVar7 = uVar7 + 1) {
        free(*(void **)((long)&(utest_state.tests)->func + lVar6));
        lVar6 = lVar6 + 0x18;
      }
      free(__ptr);
      free(utest_state.tests);
      if (utest_state.output != (FILE *)0x0) {
        fclose((FILE *)utest_state.output);
      }
      return (int)local_48;
    }
    pcVar8 = argv[uVar7];
    iVar3 = utest_strncmp(pcVar8,"--help",6);
    if (iVar3 == 0) {
      puts(
          "utest.h - the single file unit testing solution for C/C++!\nCommand line Options:\n  --help            Show this message and exit.\n  --filter=<filter> Filter the test cases to run (EG. MyTest*.a would run MyTestCase.a but not MyTestCase.b).\n  --output=<output> Output an xunit XML file to the file specified in <output>."
          );
      __ptr = (void *)0x0;
      local_48 = 0;
      goto LAB_0010b257;
    }
    iVar3 = utest_strncmp(pcVar8,"--filter=",9);
    if (iVar3 == 0) {
      local_70 = pcVar8 + 9;
    }
    else {
      iVar3 = utest_strncmp(pcVar8,"--output=",9);
      if (iVar3 == 0) {
        utest_state.output = (FILE *)fopen(pcVar8 + 9,"w+");
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

UTEST_WEAK int utest_main(int argc, const char *const argv[]) {
  uint64_t failed = 0;
  size_t index = 0;
  size_t *failed_testcases = 0;
  size_t failed_testcases_length = 0;
  const char *filter = 0;
  uint64_t ran_tests = 0;

  enum colours { RESET, GREEN, RED };

  const int use_colours = UTEST_COLOUR_OUTPUT();
  const char *colours[] = {"\033[0m", "\033[32m", "\033[31m"};
  if (!use_colours) {
    for (index = 0; index < sizeof colours / sizeof colours[0]; index++) {
      colours[index] = "";
    }
  }
  /* loop through all arguments looking for our options */
  for (index = 1; index < UTEST_CAST(size_t, argc); index++) {
    const char help_str[] = "--help";
    const char filter_str[] = "--filter=";
    const char output_str[] = "--output=";

    if (0 == utest_strncmp(argv[index], help_str, strlen(help_str))) {
      printf("utest.h - the single file unit testing solution for C/C++!\n"
             "Command line Options:\n"
             "  --help            Show this message and exit.\n"
             "  --filter=<filter> Filter the test cases to run (EG. MyTest*.a "
             "would run MyTestCase.a but not MyTestCase.b).\n"
             "  --output=<output> Output an xunit XML file to the file "
             "specified in <output>.\n");
      goto cleanup;
    } else if (0 ==
               utest_strncmp(argv[index], filter_str, strlen(filter_str))) {
      /* user wants to filter what test cases run! */
      filter = argv[index] + strlen(filter_str);
    } else if (0 ==
               utest_strncmp(argv[index], output_str, strlen(output_str))) {
      utest_state.output = utest_fopen(argv[index] + strlen(output_str), "w+");
    }
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    ran_tests++;
  }

  printf("%s[==========]%s Running %" UTEST_PRIu64 " test cases.\n",
         colours[GREEN], colours[RESET], UTEST_CAST(uint64_t, ran_tests));

  if (utest_state.output) {
    fprintf(utest_state.output, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
    fprintf(utest_state.output,
            "<testsuites tests=\"%" UTEST_PRIu64 "\" name=\"All\">\n",
            UTEST_CAST(uint64_t, ran_tests));
    fprintf(utest_state.output,
            "<testsuite name=\"Tests\" tests=\"%" UTEST_PRIu64 "\">\n",
            UTEST_CAST(uint64_t, ran_tests));
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    int result = 0;
    int64_t ns = 0;

    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    printf("%s[ RUN      ]%s %s\n", colours[GREEN], colours[RESET],
           utest_state.tests[index].name);

    if (utest_state.output) {
      fprintf(utest_state.output, "<testcase name=\"%s\">",
              utest_state.tests[index].name);
    }

    ns = utest_ns();
    utest_state.tests[index].func(&result, utest_state.tests[index].index);
    ns = utest_ns() - ns;

    if (utest_state.output) {
      fprintf(utest_state.output, "</testcase>\n");
    }

    if (0 != result) {
      const size_t failed_testcase_index = failed_testcases_length++;
      failed_testcases = UTEST_PTR_CAST(
          size_t *, realloc(UTEST_PTR_CAST(void *, failed_testcases),
                            sizeof(size_t) * failed_testcases_length));
      failed_testcases[failed_testcase_index] = index;
      failed++;
      printf("%s[  FAILED  ]%s %s (%" UTEST_PRId64 "ns)\n", colours[RED],
             colours[RESET], utest_state.tests[index].name, ns);
    } else {
      printf("%s[       OK ]%s %s (%" UTEST_PRId64 "ns)\n", colours[GREEN],
             colours[RESET], utest_state.tests[index].name, ns);
    }
  }

  printf("%s[==========]%s %" UTEST_PRIu64 " test cases ran.\n", colours[GREEN],
         colours[RESET], ran_tests);
  printf("%s[  PASSED  ]%s %" UTEST_PRIu64 " tests.\n", colours[GREEN],
         colours[RESET], ran_tests - failed);

  if (0 != failed) {
    printf("%s[  FAILED  ]%s %" UTEST_PRIu64 " tests, listed below:\n",
           colours[RED], colours[RESET], failed);
    for (index = 0; index < failed_testcases_length; index++) {
      printf("%s[  FAILED  ]%s %s\n", colours[RED], colours[RESET],
             utest_state.tests[failed_testcases[index]].name);
    }
  }

  if (utest_state.output) {
    fprintf(utest_state.output, "</testsuite>\n</testsuites>\n");
  }

cleanup:
  for (index = 0; index < utest_state.tests_length; index++) {
    free(UTEST_PTR_CAST(void *, utest_state.tests[index].name));
  }

  free(UTEST_PTR_CAST(void *, failed_testcases));
  free(UTEST_PTR_CAST(void *, utest_state.tests));

  if (utest_state.output) {
    fclose(utest_state.output);
  }

  return UTEST_CAST(int, failed);
}